

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O1

Scope * __thiscall flow::lang::Lexer::enterScope(Lexer *this,string *filename)

{
  int __v;
  tuple<std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  this_00;
  Scope *pSVar1;
  system_error *this_01;
  int *piVar2;
  error_category *__ecat;
  pointer *__ptr;
  __uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  local_28;
  
  this_00.
  super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
        )operator_new(0x208);
  std::ifstream::ifstream
            ((void *)this_00.
                     super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                     ._M_head_impl);
  std::ifstream::open((string *)
                      this_00.
                      super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                      ._M_head_impl,(_Ios_Openmode)filename);
  if (*(int *)((string *)
               ((long)this_00.
                      super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                      ._M_head_impl + 0x20) +
              *(long *)(*(long *)this_00.
                                 super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                                 ._M_head_impl + -0x18)) == 0) {
    local_28._M_t.
    super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
    .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>._M_head_impl
         = (tuple<std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
            )(tuple<std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
              )this_00.
               super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl;
    pSVar1 = enterScope(this,(unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                              *)&local_28,filename);
    if ((_Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
         )local_28._M_t.
          super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
          .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
          _M_head_impl != (basic_istream<char,_std::char_traits<char>_> *)0x0) {
      (**(code **)(*(long *)local_28._M_t.
                            super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
    return pSVar1;
  }
  this_01 = (system_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  __v = *piVar2;
  __ecat = (error_category *)std::_V2::system_category();
  std::system_error::system_error(this_01,__v,__ecat);
  __cxa_throw(this_01,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

Lexer::Scope* Lexer::enterScope(const std::string& filename) {
  auto ifs = std::make_unique<std::ifstream>();

  ifs->open(filename);
  if (!ifs->good())
    throw std::system_error(errno, std::system_category());

  return enterScope(std::move(ifs), filename);
}